

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O2

NodeAVL * avlBalance(NodeAVL *nd)

{
  int iVar1;
  NodeAVL *pNVar2;
  
  avlFixHeight(nd);
  iVar1 = avlBfactor(nd);
  if (iVar1 == -2) {
    pNVar2 = nd->left;
    iVar1 = avlBfactor(pNVar2);
    if (0 < iVar1) {
      pNVar2 = avlRotateLeft(pNVar2);
      nd->left = pNVar2;
    }
    pNVar2 = avlRotateRight(nd);
    return pNVar2;
  }
  if (iVar1 == 2) {
    pNVar2 = nd->right;
    iVar1 = avlBfactor(pNVar2);
    if (iVar1 < 0) {
      pNVar2 = avlRotateRight(pNVar2);
      nd->right = pNVar2;
    }
    pNVar2 = avlRotateLeft(nd);
    return pNVar2;
  }
  return nd;
}

Assistant:

static
NodeAVL* avlBalance( NodeAVL* nd ){
    #ifdef DEBUG_AVL
      printf( "avlBalance id=%d\n", nd->id );
    #endif
    avlFixHeight(nd);
    if( avlBfactor(nd)==2 ){
        if( avlBfactor(nd->right) < 0 ) nd->right = avlRotateRight(nd->right);
        return avlRotateLeft(nd);
    }
    if( avlBfactor(nd)==-2 ){
        if( avlBfactor(nd->left) > 0  ) nd->left = avlRotateLeft(nd->left);
        return avlRotateRight(nd);
    }
    return nd;
}